

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

RealType __thiscall OpenMD::Snapshot::getXZarea(Snapshot *this)

{
  Mat3x3d *this_00;
  RealType RVar1;
  Vector<double,_3U> VStack_68;
  Vector3d z;
  Vector3d x;
  
  if (this->hasXZarea == true) {
    RVar1 = (this->frameData).xzArea;
  }
  else {
    this_00 = &(this->frameData).hmat;
    RectMatrix<double,_3U,_3U>::getColumn
              (&z.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)this_00,0);
    Vector<double,_3U>::Vector(&x.super_Vector<double,_3U>,&z.super_Vector<double,_3U>);
    RectMatrix<double,_3U,_3U>::getColumn(&VStack_68,(RectMatrix<double,_3U,_3U> *)this_00,2);
    Vector<double,_3U>::Vector(&z.super_Vector<double,_3U>,&VStack_68);
    cross<double>((Vector3<double> *)&VStack_68,(Vector3<double> *)&x.super_Vector<double,_3U>,
                  (Vector3<double> *)&z.super_Vector<double,_3U>);
    RVar1 = Vector<double,_3U>::length(&VStack_68);
    (this->frameData).xzArea = RVar1;
    this->hasXZarea = true;
  }
  return RVar1;
}

Assistant:

RealType Snapshot::getXZarea() {
    if (!hasXZarea) {
      Vector3d x       = frameData.hmat.getColumn(0);
      Vector3d z       = frameData.hmat.getColumn(2);
      frameData.xzArea = cross(x, z).length();
      hasXZarea        = true;
    }
    return frameData.xzArea;
  }